

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdHist.c
# Opt level: O1

void Cmd_HistoryPrint(Abc_Frame_t *p,int Limit)

{
  return;
}

Assistant:

void Cmd_HistoryPrint( Abc_Frame_t * p, int Limit )
{
#if defined(WIN32) 
    char * pStr; 
    int i;
    Limit = Abc_MaxInt( 0, Vec_PtrSize(p->aHistory)-Limit );
    printf( "================== Command history ==================\n" );
    Vec_PtrForEachEntryStart( char *, p->aHistory, pStr, i, Limit )
        printf( "%s\n", pStr );
    printf( "=====================================================\n" );
#endif
}